

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::StatsdPullAtomConfig::~StatsdPullAtomConfig(StatsdPullAtomConfig *this)

{
  StatsdPullAtomConfig *this_local;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__StatsdPullAtomConfig_009c15a8;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->packages_);
  std::vector<int,_std::allocator<int>_>::~vector(&this->raw_pull_atom_id_);
  std::vector<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>::
  ~vector(&this->pull_atom_id_);
  protozero::CppMessageObj::~CppMessageObj(&this->super_CppMessageObj);
  return;
}

Assistant:

StatsdPullAtomConfig::~StatsdPullAtomConfig() = default;